

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O0

void composition_source_in(uint32_t *dest,int length,uint32_t *src,uint32_t const_alpha)

{
  uint y;
  uint32_t uVar1;
  uint32_t s;
  uint32_t d;
  int i_1;
  uint32_t cia;
  int i;
  uint32_t const_alpha_local;
  uint32_t *src_local;
  int length_local;
  uint32_t *dest_local;
  
  if (const_alpha == 0xff) {
    for (i_1 = 0; i_1 < length; i_1 = i_1 + 1) {
      uVar1 = BYTE_MUL(src[i_1],dest[i_1] >> 0x18);
      dest[i_1] = uVar1;
    }
  }
  else {
    for (s = 0; (int)s < length; s = s + 1) {
      y = dest[(int)s];
      uVar1 = BYTE_MUL(src[(int)s],const_alpha);
      uVar1 = INTERPOLATE_PIXEL(uVar1,y >> 0x18,y,0xff - const_alpha);
      dest[(int)s] = uVar1;
    }
  }
  return;
}

Assistant:

static void composition_source_in(uint32_t* dest, int length, const uint32_t* src, uint32_t const_alpha)
{
    if(const_alpha == 255) {
        for(int i = 0; i < length; i++) {
            dest[i] = BYTE_MUL(src[i], plutovg_alpha(dest[i]));
        }
    } else {
        uint32_t cia = 255 - const_alpha;
        for(int i = 0; i < length; i++) {
            uint32_t d = dest[i];
            uint32_t s = BYTE_MUL(src[i], const_alpha);
            dest[i] = INTERPOLATE_PIXEL(s, plutovg_alpha(d), d, cia);
        }
    }
}